

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O1

void CVmBifTIO::banner_get_info(uint argc)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  uint banner;
  int iVar3;
  vm_obj_id_t obj;
  void *pvVar4;
  CVmConsoleBanner *this;
  CVmObjList *this_00;
  os_banner_info_t info;
  vm_val_t local_60;
  os_banner_info_t local_50;
  
  CVmBif::check_argc(argc,1);
  banner = CVmBif::pop_int_val();
  pvVar4 = CVmBannerManager::get_os_handle(G_console_X->banner_manager_,banner);
  this = (CVmConsoleBanner *)0x0;
  if (0 < (int)banner) {
    if ((ulong)banner <= (G_console_X->banner_manager_->super_CVmHandleManager).handles_max_) {
      this = (CVmConsoleBanner *)
             (G_console_X->banner_manager_->super_CVmHandleManager).handles_[(ulong)banner - 1];
    }
  }
  if ((pvVar4 != (void *)0x0) && (this != (CVmConsoleBanner *)0x0)) {
    iVar3 = CVmConsoleBanner::get_banner_info(this,&local_50);
    if (iVar3 == 0) {
      CVmBif::retval_nil();
    }
    else {
      obj = CVmObjList::create(0,6);
      pvVar2 = sp_;
      this_00 = (CVmObjList *)
                ((long)&G_obj_table_X.pages_[obj >> 0xc]->ptr_ + (ulong)((obj & 0xfff) * 0x18));
      pvVar1 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar1 = VM_OBJ;
      (pvVar2->val).obj = obj;
      local_60.typ = VM_INT;
      local_60.val.obj = local_50.align;
      CVmObjList::cons_set_element(this_00,0,&local_60);
      local_60.typ = VM_INT;
      local_60.val.obj = (vm_obj_id_t)local_50.style;
      CVmObjList::cons_set_element(this_00,1,&local_60);
      local_60.typ = VM_INT;
      local_60.val.obj = local_50.rows;
      CVmObjList::cons_set_element(this_00,2,&local_60);
      local_60.typ = VM_INT;
      local_60.val.obj = local_50.columns;
      CVmObjList::cons_set_element(this_00,3,&local_60);
      local_60.typ = VM_INT;
      local_60.val.obj = local_50.pix_height;
      CVmObjList::cons_set_element(this_00,4,&local_60);
      local_60.typ = VM_INT;
      local_60.val.obj = local_50.pix_width;
      CVmObjList::cons_set_element(this_00,5,&local_60);
      CVmBif::retval_obj(obj);
      sp_ = sp_ + -1;
    }
    return;
  }
  err_throw(0x902);
}

Assistant:

void CVmBifTIO::banner_get_info(VMG_ uint argc)
{
    int id;
    void *hdl;
    os_banner_info_t info;
    CVmConsoleBanner *console;

    /* check arguments */
    check_argc(vmg_ argc, 1);

    /* get the banner ID */
    id = pop_int_val(vmg0_);

    /* get the banner - if it's invalid, throw an error */
    hdl = G_console->get_banner_manager()->get_os_handle(id);
    console = G_console->get_banner_manager()->get_console(id);
    if (hdl == 0 || console == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* get information on the banner */
    if (console->get_banner_info(&info))
    {
        vm_obj_id_t lst_obj;
        CVmObjList *lst;
        vm_val_t val;
        
        /* set up a return list with space for six entries */
        lst_obj = CVmObjList::create(vmg_ FALSE, 6);
        lst = (CVmObjList *)vm_objp(vmg_ lst_obj);

        /* save the list on the stack to protect against garbage collection */
        val.set_obj(lst_obj);
        G_stk->push(&val);

        /* 
         *   return the values: [align, style, rows, columns, pix_height,
         *   pix_width] 
         */
        set_list_int(lst, 0, info.align);
        set_list_int(lst, 1, info.style);
        set_list_int(lst, 2, info.rows);
        set_list_int(lst, 3, info.columns);
        set_list_int(lst, 4, info.pix_height);
        set_list_int(lst, 5, info.pix_width);

        /* return the list */
        retval_obj(vmg_ lst_obj);

        /* discard our gc protection */
        G_stk->discard();
    }
    else
    {
        /* no information available - return nil */
        retval_nil(vmg0_);
    }